

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::IEEEFloat::initFromHalfAPInt(IEEEFloat *this,APInt *api)

{
  byte bVar1;
  ulong uVar2;
  fltSemantics *pfVar3;
  ulong uVar4;
  uint uVar5;
  Significand *pSVar6;
  byte bVar7;
  Significand *pSVar8;
  Significand SVar9;
  Significand SVar10;
  
  if (api->BitWidth != 0x10) {
    __assert_fail("api.getBitWidth()==16",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc7f,"void llvm::detail::IEEEFloat::initFromHalfAPInt(const APInt &)");
  }
  uVar2 = (api->U).VAL;
  initialize(this,(fltSemantics *)semIEEEhalf);
  pfVar3 = this->semantics;
  if (0x3f < pfVar3->precision) {
    __assert_fail("partCount()==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc85,"void llvm::detail::IEEEFloat::initFromHalfAPInt(const APInt &)");
  }
  uVar4 = uVar2 >> 10;
  uVar5 = (uint)uVar4 & 0x1f;
  bVar1 = this->field_0x12;
  bVar7 = (byte)(uVar2 >> 0xc) & 8;
  if ((uVar4 & 0x1f) == 0 && (uVar2 & 0x3ff) == 0) {
    bVar7 = bVar1 & 0xf0 | bVar7 | 3;
  }
  else {
    if (uVar5 != 0x1f || (uVar2 & 0x3ff) != 0) {
      bVar7 = bVar1 & 0xf0 | bVar7;
      if ((uVar2 & 0x3ff) != 0 && uVar5 == 0x1f) {
        this->field_0x12 = bVar7 | 1;
        SVar9._0_4_ = (uint)uVar2 & 0x3ff;
        SVar9.part._4_4_ = 0;
        if (pfVar3->precision - 0x40 < 0xffffff80) {
          pSVar6 = (Significand *)(this->significand).parts;
        }
        else {
          pSVar6 = &this->significand;
        }
        *pSVar6 = SVar9;
        return;
      }
      this->field_0x12 = bVar7 | 2;
      this->exponent = (short)uVar5 + -0xf;
      SVar10._0_4_ = (uint)uVar2 & 0x3ff;
      SVar10.part._4_4_ = 0;
      uVar5 = pfVar3->precision - 0x40;
      pSVar6 = &this->significand;
      pSVar8 = pSVar6;
      if (uVar5 < 0xffffff80) {
        pSVar8 = (Significand *)(this->significand).parts;
      }
      *pSVar8 = SVar10;
      if ((uVar4 & 0x1f) != 0) {
        if (uVar5 < 0xffffff80) {
          pSVar6 = (Significand *)pSVar6->parts;
        }
        pSVar6->part = pSVar6->part | 0x400;
        return;
      }
      this->exponent = -0xe;
      return;
    }
    bVar7 = bVar1 & 0xf0 | bVar7;
  }
  this->field_0x12 = bVar7;
  return;
}

Assistant:

void IEEEFloat::initFromHalfAPInt(const APInt &api) {
  assert(api.getBitWidth()==16);
  uint32_t i = (uint32_t)*api.getRawData();
  uint32_t myexponent = (i >> 10) & 0x1f;
  uint32_t mysignificand = i & 0x3ff;

  initialize(&semIEEEhalf);
  assert(partCount()==1);

  sign = i >> 15;
  if (myexponent==0 && mysignificand==0) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0x1f && mysignificand==0) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0x1f && mysignificand!=0) {
    // sign, exponent, significand meaningless
    category = fcNaN;
    *significandParts() = mysignificand;
  } else {
    category = fcNormal;
    exponent = myexponent - 15;  //bias
    *significandParts() = mysignificand;
    if (myexponent==0)    // denormal
      exponent = -14;
    else
      *significandParts() |= 0x400; // integer bit
  }
}